

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_atomic_func_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,char *op,Op opcode,
          uint32_t mem_order_1,uint32_t mem_order_2,bool has_mem_order_2,uint32_t obj,uint32_t op1,
          bool op1_is_pointer,bool op1_is_literal,uint32_t op2)

{
  uint32_t id;
  bool bVar1;
  int iVar2;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  CompilerError *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_register_00000084;
  char (*ts_2) [4];
  byte bVar6;
  _Alloc_hider in_stack_fffffffffffffdd8;
  string exp;
  BaseType local_1dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  uint32_t local_1b4;
  SPIRVariable *local_1b0;
  char *local_1a8;
  string local_1a0;
  SPIRType remapped_type;
  
  ts_2 = (char (*) [4])CONCAT44(in_register_00000084,opcode);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffdd8;
  exp._M_dataplus._M_p = (pointer)&exp.field_2;
  exp._M_string_length = 0;
  exp.field_2._M_local_buf[0] = '\0';
  local_1b4 = result_type;
  local_1a8 = op;
  pSVar3 = Compiler::expression_type((Compiler *)this,obj);
  pSVar3 = Compiler::get_pointee_type((Compiler *)this,pSVar3);
  if ((opcode & ~OpSourceContinued) == OpAtomicUMin) {
    local_1dc = to_unsigned_basetype(pSVar3->width);
  }
  else if ((opcode & ~OpSourceContinued) == OpAtomicSMin) {
    local_1dc = to_signed_basetype(pSVar3->width);
  }
  else {
    local_1dc = *(BaseType *)&(pSVar3->super_IVariant).field_0xc;
  }
  if (pSVar3->width == 0x40) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&remapped_type,"MSL currently does not support 64-bit atomics.",
               (allocator *)&stack0xfffffffffffffdd8);
    CompilerError::CompilerError(pCVar5,(string *)&remapped_type);
    __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  SPIRType::SPIRType(&remapped_type,pSVar3);
  remapped_type.super_IVariant._12_4_ = local_1dc;
  local_1b0 = Compiler::maybe_get_backing_variable((Compiler *)this,obj);
  if (local_1b0 == (SPIRVariable *)0x0) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffdd8,"No backing variable for atomic operation.",
               (allocator *)&local_1d8);
    CompilerError::CompilerError(pCVar5,(string *)&stack0xfffffffffffffdd8);
    __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pSVar4 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(local_1b0->super_IVariant).field_0xc);
  bVar6 = op1 != 0 & op1_is_pointer;
  if (((opcode == OpAtomicLoad) || (bVar1 = needs_frag_discard_checks(this), !bVar1)) ||
     (((pSVar4->storage != StorageClassUniformConstant ||
       (*(int *)&(pSVar4->super_IVariant).field_0xc != 0x10)) &&
      ((local_1b0->storage != StorageClassStorageBuffer &&
       (local_1b0->storage != StorageClassUniform)))))) {
    bVar1 = false;
  }
  else if (bVar6 == 0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&local_1d8,this,0x17,1);
    join<char_const(&)[3],std::__cxx11::string,char_const(&)[4]>
              ((string *)&stack0xfffffffffffffdd8,(spirv_cross *)0x3b237e,(char (*) [3])&local_1d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3aa7eb,ts_2);
    ::std::__cxx11::string::operator=((string *)&exp,(string *)&stack0xfffffffffffffdd8);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    ::std::__cxx11::string::~string((string *)&local_1d8);
    bVar1 = true;
  }
  else {
    CompilerGLSL::emit_uninitialized_temporary_expression
              (&this->super_CompilerGLSL,local_1b4,result_id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              (&stack0xfffffffffffffdd8,this,0x17,1);
    CompilerGLSL::statement<char_const(&)[6],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [6])"if (!",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffdd8,(char (*) [2])0x39e39a);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    bVar1 = true;
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  }
  ::std::__cxx11::string::string((string *)&local_1d8,local_1a8,(allocator *)&local_1a0);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,&local_1d8,"(");
  ::std::__cxx11::string::append((string *)&exp);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
  ::std::__cxx11::string::~string((string *)&local_1d8);
  ::std::__cxx11::string::append((char *)&exp);
  if ((pSVar4->storage == StorageClassUniformConstant) &&
     (*(int *)&(pSVar4->super_IVariant).field_0xc == 0x10)) {
    ::std::__cxx11::string::append((char *)&exp);
  }
  else {
    get_argument_address_space_abi_cxx11_((string *)&stack0xfffffffffffffdd8,this,local_1b0);
    ::std::__cxx11::string::append((string *)&exp);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
  }
  ::std::__cxx11::string::append((char *)&exp);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&stack0xfffffffffffffdd8,this,&remapped_type,0);
  ::std::__cxx11::string::append((string *)&exp);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
  ::std::__cxx11::string::append((char *)&exp);
  ::std::__cxx11::string::append((char *)&exp);
  CompilerGLSL::to_enclosed_expression_abi_cxx11_
            ((string *)&stack0xfffffffffffffdd8,&this->super_CompilerGLSL,obj,true);
  ::std::__cxx11::string::append((string *)&exp);
  id = op2;
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
  iVar2 = strcmp(local_1a8,"atomic_compare_exchange_weak_explicit");
  if (bVar6 == 0) {
    if (iVar2 == 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2669,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (op1 != 0) {
      if (op1_is_literal == false) {
        CompilerGLSL::bitcast_expression_abi_cxx11_
                  (&local_1d8,&this->super_CompilerGLSL,local_1dc,op1);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffdd8,", ",&local_1d8);
        ::std::__cxx11::string::append((string *)&exp);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
        this_00 = &local_1d8;
      }
      else {
        join<char_const(&)[3],unsigned_int&>
                  ((string *)&stack0xfffffffffffffdd8,(spirv_cross *)0x3b2a97,(char (*) [3])&op1,
                   (uint *)(ulong)op1);
        ::std::__cxx11::string::append((string *)&exp);
      }
      ::std::__cxx11::string::~string((string *)this_00);
    }
    if (id != 0) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_1d8,&this->super_CompilerGLSL,id,true);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdd8,", ",&local_1d8);
      ::std::__cxx11::string::append((string *)&exp);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
    }
    ::std::__cxx11::string::string((string *)&local_1d8,", ",(allocator *)&local_1a0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffdd8,&local_1d8,"memory_order_relaxed");
    ::std::__cxx11::string::append((string *)&exp);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    ::std::__cxx11::string::~string((string *)&local_1d8);
    if (has_mem_order_2) {
      ::std::__cxx11::string::string((string *)&local_1d8,", ",(allocator *)&local_1a0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdd8,&local_1d8,"memory_order_relaxed");
      ::std::__cxx11::string::append((string *)&exp);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
    }
    ::std::__cxx11::string::append((char *)&exp);
    if (bVar1) {
      ::std::__cxx11::string::append((char *)&exp);
      iVar2 = strcmp(local_1a8,"atomic_store_explicit");
      if (iVar2 != 0) {
        ::std::__cxx11::string::append((char *)&exp);
        ::std::__cxx11::string::append((char *)&exp);
        if ((pSVar4->storage == StorageClassUniformConstant) &&
           (*(int *)&(pSVar4->super_IVariant).field_0xc == 0x10)) {
          ::std::__cxx11::string::append((char *)&exp);
        }
        else {
          get_argument_address_space_abi_cxx11_((string *)&stack0xfffffffffffffdd8,this,local_1b0);
          ::std::__cxx11::string::append((string *)&exp);
          ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
        }
        ::std::__cxx11::string::append((char *)&exp);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&stack0xfffffffffffffdd8,this,&remapped_type,0);
        ::std::__cxx11::string::append((string *)&exp);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
        ::std::__cxx11::string::append((char *)&exp);
        ::std::__cxx11::string::append((char *)&exp);
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  ((string *)&stack0xfffffffffffffdd8,&this->super_CompilerGLSL,obj,true);
        ::std::__cxx11::string::append((string *)&exp);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
        if (has_mem_order_2) {
          ::std::__cxx11::string::string((string *)&local_1d8,", ",(allocator *)&local_1a0);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffdd8,&local_1d8,"memory_order_relaxed");
          ::std::__cxx11::string::append((string *)&exp);
        }
        else {
          ::std::__cxx11::string::string((string *)&local_1d8,", ",(allocator *)&local_1a0);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffdd8,&local_1d8,"memory_order_relaxed");
          ::std::__cxx11::string::append((string *)&exp);
        }
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
        ::std::__cxx11::string::~string((string *)&local_1d8);
      }
      ::std::__cxx11::string::append((char *)&exp);
      ::std::__cxx11::string::append((char *)&exp);
    }
    if (local_1dc != *(BaseType *)&(pSVar3->super_IVariant).field_0xc) {
      CompilerGLSL::bitcast_expression
                ((string *)&stack0xfffffffffffffdd8,&this->super_CompilerGLSL,pSVar3,local_1dc,&exp)
      ;
      ::std::__cxx11::string::operator=((string *)&exp,(string *)&stack0xfffffffffffffdd8);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    }
    iVar2 = strcmp(local_1a8,"atomic_store_explicit");
    if (iVar2 == 0) {
      CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,&exp,(char (*) [2])0x39d4f0);
    }
    else {
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_1b4,result_id,&exp,false,false);
    }
  }
  else {
    if (iVar2 != 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x262f,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (id == 0) {
      __assert_fail("op2",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2630,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (!has_mem_order_2) {
      __assert_fail("has_mem_order_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2631,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    ::std::__cxx11::string::append((char *)&exp);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&stack0xfffffffffffffdd8,this,(ulong)result_id,1);
    ::std::__cxx11::string::append((string *)&exp);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    ::std::__cxx11::string::append((char *)&exp);
    CompilerGLSL::to_expression_abi_cxx11_
              ((string *)&stack0xfffffffffffffdd8,&this->super_CompilerGLSL,id,true);
    ::std::__cxx11::string::append((string *)&exp);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    if (!bVar1) {
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,local_1b4,result_id);
    }
    CompilerGLSL::statement<char_const(&)[3]>(&this->super_CompilerGLSL,(char (*) [3])"do");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&stack0xfffffffffffffdd8,this,(ulong)result_id,1);
    CompilerGLSL::to_expression_abi_cxx11_(&local_1d8,&this->super_CompilerGLSL,op1,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffdd8,(char (*) [4])0x3b58ce,&local_1d8,(char (*) [2])0x39d4f0);
    ::std::__cxx11::string::~string((string *)&local_1d8);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_1d8,this,(ulong)result_id,1);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_1a0,&this->super_CompilerGLSL,op1,true);
    join<char_const(&)[9],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
              ((string *)&stack0xfffffffffffffdd8,(spirv_cross *)"while (!",(char (*) [9])&exp,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" && ",
               (char (*) [5])&local_1d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" == ",
               (char (*) [5])&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,
               (char (*) [2])in_stack_fffffffffffffdd8._M_p);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL,(string *)&stack0xfffffffffffffdd8);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_1d8);
    if (bVar1) {
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[5]>(&this->super_CompilerGLSL,(char (*) [5])0x39547c);
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      ::std::__cxx11::string::assign((char *)&exp);
      ::std::__cxx11::string::append((char *)&exp);
      if ((pSVar4->storage == StorageClassUniformConstant) &&
         (*(int *)&(pSVar4->super_IVariant).field_0xc == 0x10)) {
        ::std::__cxx11::string::append((char *)&exp);
      }
      else {
        get_argument_address_space_abi_cxx11_((string *)&stack0xfffffffffffffdd8,this,local_1b0);
        ::std::__cxx11::string::append((string *)&exp);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      }
      ::std::__cxx11::string::append((char *)&exp);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&stack0xfffffffffffffdd8,this,&remapped_type,0);
      ::std::__cxx11::string::append((string *)&exp);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      ::std::__cxx11::string::append((char *)&exp);
      ::std::__cxx11::string::append((char *)&exp);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                ((string *)&stack0xfffffffffffffdd8,&this->super_CompilerGLSL,obj,true);
      ::std::__cxx11::string::append((string *)&exp);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      ::std::__cxx11::string::string((string *)&local_1d8,", ",(allocator *)&local_1a0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdd8,&local_1d8,"memory_order_relaxed");
      ::std::__cxx11::string::append((string *)&exp);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::__cxx11::string::append((char *)&exp);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&stack0xfffffffffffffdd8,this,(ulong)result_id,1);
      CompilerGLSL::
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffdd8,(char (*) [4])0x3b58ce,&exp,(char (*) [2])0x39d4f0);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    }
  }
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  SPIRType::~SPIRType(&remapped_type);
  ::std::__cxx11::string::~string((string *)&exp);
  return;
}

Assistant:

void CompilerMSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, const char *op, Op opcode,
                                      uint32_t mem_order_1, uint32_t mem_order_2, bool has_mem_order_2, uint32_t obj, uint32_t op1,
                                      bool op1_is_pointer, bool op1_is_literal, uint32_t op2)
{
	string exp;

	auto &type = get_pointee_type(expression_type(obj));
	auto expected_type = type.basetype;
	if (opcode == OpAtomicUMax || opcode == OpAtomicUMin)
		expected_type = to_unsigned_basetype(type.width);
	else if (opcode == OpAtomicSMax || opcode == OpAtomicSMin)
		expected_type = to_signed_basetype(type.width);

	if (type.width == 64)
		SPIRV_CROSS_THROW("MSL currently does not support 64-bit atomics.");

	auto remapped_type = type;
	remapped_type.basetype = expected_type;

	auto *var = maybe_get_backing_variable(obj);
	if (!var)
		SPIRV_CROSS_THROW("No backing variable for atomic operation.");
	const auto &res_type = get<SPIRType>(var->basetype);

	bool is_atomic_compare_exchange_strong = op1_is_pointer && op1;

	bool check_discard = opcode != OpAtomicLoad && needs_frag_discard_checks() &&
	                     ((res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image) ||
	                      var->storage == StorageClassStorageBuffer || var->storage == StorageClassUniform);

	if (check_discard)
	{
		if (is_atomic_compare_exchange_strong)
		{
			// We're already emitting a CAS loop here; a conditional won't hurt.
			emit_uninitialized_temporary_expression(result_type, result_id);
			statement("if (!", builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput), ")");
			begin_scope();
		}
		else
			exp = join("(!", builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput), " ? ");
	}

	exp += string(op) + "(";
	exp += "(";
	// Emulate texture2D atomic operations
	if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
	{
		exp += "device";
	}
	else
	{
		exp += get_argument_address_space(*var);
	}

	exp += " atomic_";
	// For signed and unsigned min/max, we can signal this through the pointer type.
	// There is no other way, since C++ does not have explicit signage for atomics.
	exp += type_to_glsl(remapped_type);
	exp += "*)";

	exp += "&";
	exp += to_enclosed_expression(obj);

	if (is_atomic_compare_exchange_strong)
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") == 0);
		assert(op2);
		assert(has_mem_order_2);
		exp += ", &";
		exp += to_name(result_id);
		exp += ", ";
		exp += to_expression(op2);
		exp += ", ";
		exp += get_memory_order(mem_order_1);
		exp += ", ";
		exp += get_memory_order(mem_order_2);
		exp += ")";

		// MSL only supports the weak atomic compare exchange, so emit a CAS loop here.
		// The MSL function returns false if the atomic write fails OR the comparison test fails,
		// so we must validate that it wasn't the comparison test that failed before continuing
		// the CAS loop, otherwise it will loop infinitely, with the comparison test always failing.
		// The function updates the comparitor value from the memory value, so the additional
		// comparison test evaluates the memory value against the expected value.
		if (!check_discard)
			emit_uninitialized_temporary_expression(result_type, result_id);
		statement("do");
		begin_scope();
		statement(to_name(result_id), " = ", to_expression(op1), ";");
		end_scope_decl(join("while (!", exp, " && ", to_name(result_id), " == ", to_enclosed_expression(op1), ")"));
		if (check_discard)
		{
			end_scope();
			statement("else");
			begin_scope();
			exp = "atomic_load_explicit(";
			exp += "(";
			// Emulate texture2D atomic operations
			if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
				exp += "device";
			else
				exp += get_argument_address_space(*var);

			exp += " atomic_";
			exp += type_to_glsl(remapped_type);
			exp += "*)";

			exp += "&";
			exp += to_enclosed_expression(obj);

			if (has_mem_order_2)
				exp += string(", ") + get_memory_order(mem_order_2);
			else
				exp += string(", ") + get_memory_order(mem_order_1);

			exp += ")";

			statement(to_name(result_id), " = ", exp, ";");
			end_scope();
		}
	}
	else
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") != 0);
		if (op1)
		{
			if (op1_is_literal)
				exp += join(", ", op1);
			else
				exp += ", " + bitcast_expression(expected_type, op1);
		}
		if (op2)
			exp += ", " + to_expression(op2);

		exp += string(", ") + get_memory_order(mem_order_1);
		if (has_mem_order_2)
			exp += string(", ") + get_memory_order(mem_order_2);

		exp += ")";

		if (check_discard)
		{
			exp += " : ";
			if (strcmp(op, "atomic_store_explicit") != 0)
			{
				exp += "atomic_load_explicit(";
				exp += "(";
				// Emulate texture2D atomic operations
				if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
					exp += "device";
				else
					exp += get_argument_address_space(*var);

				exp += " atomic_";
				exp += type_to_glsl(remapped_type);
				exp += "*)";

				exp += "&";
				exp += to_enclosed_expression(obj);

				if (has_mem_order_2)
					exp += string(", ") + get_memory_order(mem_order_2);
				else
					exp += string(", ") + get_memory_order(mem_order_1);

				exp += ")";
			}
			else
				exp += "((void)0)";
			exp += ")";
		}

		if (expected_type != type.basetype)
			exp = bitcast_expression(type, expected_type, exp);

		if (strcmp(op, "atomic_store_explicit") != 0)
			emit_op(result_type, result_id, exp, false);
		else
			statement(exp, ";");
	}

	flush_all_atomic_capable_variables();
}